

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*=(TPZFMatrix<long_double> *this,longdouble value)

{
  long lVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  
  lVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (0 < lVar1) {
    plVar3 = this->fElem;
    plVar2 = plVar3 + lVar1;
    do {
      *plVar3 = *plVar3 * value;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar2);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}